

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
trng::utility::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          io_range<const_unsigned_int_*> *IO_range)

{
  char *__s;
  size_t sVar1;
  uint *puVar2;
  
  if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0) {
    puVar2 = IO_range->first;
    do {
      if (puVar2 == IO_range->last) {
        return out;
      }
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      puVar2 = puVar2 + 1;
      if ((puVar2 != IO_range->last) && (__s = IO_range->delim_str, __s != (char *)0x0)) {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,__s,sVar1);
      }
    } while (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0);
  }
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                     const io_range<T> &IO_range) {
      T pos{IO_range.first};
      while (out and pos != IO_range.last) {
        out << (*pos);
        ++pos;
        if (pos != IO_range.last and IO_range.delim_str != 0)
          out << IO_range.delim_str;
      }
      return out;
    }